

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsWin.c
# Opt level: O2

void Abc_MfsComputeRoots_rec(Abc_Obj_t *pNode,int nLevelMax,int nFanoutLimit,Vec_Ptr_t *vRoots)

{
  int iVar1;
  uint uVar2;
  Abc_Ntk_t *pAVar3;
  Abc_Ntk_t *pAVar4;
  uint uVar5;
  void **ppvVar6;
  ulong uVar7;
  int Fill;
  ulong uVar8;
  long lVar9;
  int iVar10;
  
  if ((*(uint *)&pNode->field_0x14 & 0xf) != 7) {
    __assert_fail("Abc_ObjIsNode(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/mfs/mfsWin.c"
                  ,0x4c,"void Abc_MfsComputeRoots_rec(Abc_Obj_t *, int, int, Vec_Ptr_t *)");
  }
  pAVar3 = pNode->pNtk;
  iVar10 = pNode->Id;
  Vec_IntFillExtra(&pAVar3->vTravIds,iVar10 + 1,nFanoutLimit);
  if ((-1 < (long)iVar10) && (iVar10 < (pAVar3->vTravIds).nSize)) {
    pAVar4 = pNode->pNtk;
    iVar1 = pAVar4->nTravIds;
    if ((pAVar3->vTravIds).pArray[iVar10] != iVar1) {
      iVar10 = pNode->Id;
      Vec_IntFillExtra(&pAVar4->vTravIds,iVar10 + 1,Fill);
      if (((long)iVar10 < 0) || ((pAVar4->vTravIds).nSize <= iVar10)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      (pAVar4->vTravIds).pArray[iVar10] = iVar1;
      uVar5 = (pNode->vFanouts).nSize;
      if ((int)uVar5 <= nFanoutLimit) {
        uVar7 = 0;
        uVar8 = 0;
        if (0 < (int)uVar5) {
          uVar8 = (ulong)uVar5;
        }
        do {
          if (uVar8 == uVar7) {
            for (lVar9 = 0; lVar9 < (int)uVar5; lVar9 = lVar9 + 1) {
              Abc_MfsComputeRoots_rec
                        ((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanouts).pArray[lVar9]],
                         nLevelMax,nFanoutLimit,vRoots);
              uVar5 = (pNode->vFanouts).nSize;
            }
            return;
          }
          uVar2 = *(uint *)((long)pNode->pNtk->vObjs->pArray[(pNode->vFanouts).pArray[uVar7]] + 0x14
                           );
        } while (((int)(uVar2 >> 0xc) <= nLevelMax) && (uVar7 = uVar7 + 1, 1 < (uVar2 & 0xf) - 3));
      }
      iVar10 = vRoots->nSize;
      if (iVar10 == vRoots->nCap) {
        uVar5 = 0x10;
        if (0xf < iVar10) {
          uVar5 = iVar10 * 2;
        }
        if (iVar10 < (int)uVar5) {
          if (vRoots->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc((ulong)uVar5 << 3);
          }
          else {
            ppvVar6 = (void **)realloc(vRoots->pArray,(ulong)uVar5 << 3);
            iVar10 = vRoots->nSize;
          }
          vRoots->pArray = ppvVar6;
          vRoots->nCap = uVar5;
        }
      }
      vRoots->nSize = iVar10 + 1;
      vRoots->pArray[iVar10] = pNode;
    }
    return;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Abc_MfsComputeRoots_rec( Abc_Obj_t * pNode, int nLevelMax, int nFanoutLimit, Vec_Ptr_t * vRoots )
{
    Abc_Obj_t * pFanout;
    int i;
    assert( Abc_ObjIsNode(pNode) );
    if ( Abc_NodeIsTravIdCurrent(pNode) )
        return;
    Abc_NodeSetTravIdCurrent( pNode );
    // check if the node should be the root
    if ( Abc_MfsComputeRootsCheck( pNode, nLevelMax, nFanoutLimit ) )
        Vec_PtrPush( vRoots, pNode );
    else // if not, explore its fanouts
        Abc_ObjForEachFanout( pNode, pFanout, i )
            Abc_MfsComputeRoots_rec( pFanout, nLevelMax, nFanoutLimit, vRoots );
}